

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.cpp
# Opt level: O0

ProStringList * __thiscall QMakeEvaluator::values(QMakeEvaluator *this,ProKey *variableName)

{
  bool bVar1;
  bool bVar2;
  const_iterator o;
  ProKey *in_RDI;
  long in_FS_OFFSET;
  bool first;
  ConstIterator it;
  const_iterator vmi;
  ProStringList *in_stack_ffffffffffffff88;
  ProKey *variableName_00;
  _Self local_30;
  const_iterator local_28;
  const_iterator local_20;
  const_iterator local_18;
  _List_const_iterator<QMap<ProKey,_ProStringList>_> local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10._M_node = (_List_node_base *)0xaaaaaaaaaaaaaaaa;
  variableName_00 = in_RDI;
  local_10._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>::cend
                 ((list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                   *)in_RDI);
  bVar2 = true;
  while( true ) {
    std::_List_const_iterator<QMap<ProKey,_ProStringList>_>::operator--(&local_10);
    local_18._M_node = (_Base_ptr)0xaaaaaaaaaaaaaaaa;
    std::_List_const_iterator<QMap<ProKey,_ProStringList>_>::operator*
              ((_List_const_iterator<QMap<ProKey,_ProStringList>_> *)0x2f18ae);
    local_18._M_node =
         (_Base_ptr)
         QMap<ProKey,_ProStringList>::constFind
                   ((QMap<ProKey,_ProStringList> *)in_stack_ffffffffffffff88,(ProKey *)0x2f18bb);
    std::_List_const_iterator<QMap<ProKey,_ProStringList>_>::operator*
              ((_List_const_iterator<QMap<ProKey,_ProStringList>_> *)0x2f18ca);
    local_20._M_node =
         (_Base_ptr)
         QMap<ProKey,_ProStringList>::constEnd
                   ((QMap<ProKey,_ProStringList> *)in_stack_ffffffffffffff88);
    bVar1 = ::operator!=((const_iterator *)in_RDI,(const_iterator *)in_stack_ffffffffffffff88);
    if (bVar1) break;
    local_30._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>::cbegin
                   ((list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                     *)in_RDI);
    bVar1 = std::operator==(&local_10,&local_30);
    if ((bVar1) || ((bVar2 && (bVar2 = isFunctParam(variableName_00), bVar2)))) goto LAB_002f199d;
    bVar2 = false;
  }
  QMap<ProKey,_ProStringList>::const_iterator::operator->((const_iterator *)0x2f18f6);
  local_28 = QList<ProString>::constBegin((QList<ProString> *)in_RDI);
  o = QList<ProString>::constBegin((QList<ProString> *)in_RDI);
  bVar2 = QList<ProString>::const_iterator::operator==(&local_28,o);
  if (bVar2) {
LAB_002f199d:
    ProStringList::ProStringList((ProStringList *)0x2f19a7);
  }
  else {
    QMap<ProKey,_ProStringList>::const_iterator::operator*((const_iterator *)0x2f193c);
    ProStringList::ProStringList((ProStringList *)in_RDI,in_stack_ffffffffffffff88);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (ProStringList *)variableName_00;
}

Assistant:

ProStringList QMakeEvaluator::values(const ProKey &variableName) const
{
    ProValueMapStack::const_iterator vmi = m_valuemapStack.cend();
    for (bool first = true; ; first = false) {
        --vmi;
        ProValueMap::ConstIterator it = (*vmi).constFind(variableName);
        if (it != (*vmi).constEnd()) {
            if (it->constBegin() == statics.fakeValue.constBegin())
                break;
            return *it;
        }
        if (vmi == m_valuemapStack.cbegin())
            break;
        if (first && isFunctParam(variableName))
            break;
    }
    return ProStringList();
}